

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O2

void __thiscall
google::protobuf::RepeatedField<unsigned_int>::~RepeatedField(RepeatedField<unsigned_int> *this)

{
  uint *puVar1;
  
  if (0 < this->total_size_) {
    puVar1 = elements(this);
    InternalDeallocate(this,(Rep *)(puVar1 + -2),this->total_size_);
    return;
  }
  return;
}

Assistant:

RepeatedField<Element>::~RepeatedField() {
  if (total_size_ > 0) {
    InternalDeallocate(rep(), total_size_);
  }
}